

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

size_t __thiscall slang::SourceManager::getLineNumber(SourceManager *this,SourceLocation location)

{
  FileInfo *this_00;
  LineDirectiveInfo *pLVar1;
  LineDirectiveInfo *lineDirective;
  shared_lock<std::shared_mutex> lock;
  FileInfo *info;
  size_t rawLineNumber;
  SourceLocation local_28;
  SourceLocation fileLocation;
  SourceManager *this_local;
  SourceLocation location_local;
  
  fileLocation = (SourceLocation)this;
  local_28 = getFullyExpandedLoc(this,location);
  location_local = (SourceLocation)getRawLineNumber(this,local_28);
  if (location_local == (SourceLocation)0x0) {
    location_local = (SourceLocation)0x0;
  }
  else {
    lock._12_4_ = SourceLocation::buffer(&local_28);
    this_00 = getFileInfo(this,(BufferID)lock._12_4_);
    std::shared_lock<std::shared_mutex>::shared_lock
              ((shared_lock<std::shared_mutex> *)&lineDirective,&this->mut);
    pLVar1 = FileInfo::getPreviousLineDirective(this_00,(size_t)location_local);
    if (pLVar1 != (LineDirectiveInfo *)0x0) {
      location_local =
           (SourceLocation)
           (pLVar1->lineOfDirective + ((long)location_local - pLVar1->lineInFile) + -1);
    }
    std::shared_lock<std::shared_mutex>::~shared_lock
              ((shared_lock<std::shared_mutex> *)&lineDirective);
  }
  return (size_t)location_local;
}

Assistant:

size_t SourceManager::getLineNumber(SourceLocation location) const {
    SourceLocation fileLocation = getFullyExpandedLoc(location);
    size_t rawLineNumber = getRawLineNumber(fileLocation);
    if (rawLineNumber == 0)
        return 0;

    auto info = getFileInfo(fileLocation.buffer());

    std::shared_lock lock(mut);
    auto lineDirective = info->getPreviousLineDirective(rawLineNumber);
    if (!lineDirective)
        return rawLineNumber;
    else
        return lineDirective->lineOfDirective + (rawLineNumber - lineDirective->lineInFile) - 1;
}